

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O1

QMetaType __thiscall QMetaType::fromName(QMetaType *this,QByteArrayView typeName)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  anon_struct_16_3_a0b52c67 *paVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QReadLocker locker;
  QMetaType local_60;
  QByteArray local_58;
  Type *local_38;
  long local_30;
  
  pcVar5 = (char *)typeName.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (int)this;
  if (iVar2 == 0) {
    iVar1 = 0;
  }
  else {
    pcVar3 = "bool";
    paVar4 = ::types;
    do {
      if (paVar4->typeNameLength == iVar2) {
        iVar1 = bcmp(pcVar5,pcVar3,(long)iVar2);
        if (iVar1 == 0) break;
      }
      pcVar3 = paVar4[1].typeName;
      paVar4 = paVar4 + 1;
    } while (pcVar3 != (char *)0x0);
    iVar1 = paVar4->type;
    if (iVar1 == 0) {
      local_38 = (Type *)&DAT_aaaaaaaaaaaaaaaa;
      if ((char)QtGlobalStatic::
                Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::
                guard._q_value.super___atomic_base<signed_char>._M_i < -1) {
        local_38 = (Type *)0x0;
      }
      else {
        local_38 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
                   ::instance();
      }
      if (((ulong)local_38 & 1) == 0 && local_38 != (Type *)0x0) {
        QReadWriteLock::lockForRead(&local_38->lock);
        local_38 = (Type *)((ulong)local_38 | 1);
      }
      iVar1 = qMetaTypeCustomType_unlocked(pcVar5,iVar2);
      if (iVar1 == 0) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QMetaObject::normalizedType(&local_58,pcVar5);
        pcVar5 = local_58.d.ptr;
        if (local_58.d.ptr == (char *)0x0) {
          pcVar5 = "";
        }
        iVar2 = (int)local_58.d.size;
        pcVar3 = "bool";
        paVar4 = ::types;
        do {
          if (paVar4->typeNameLength == iVar2) {
            iVar1 = bcmp(pcVar5,pcVar3,(long)iVar2);
            if (iVar1 == 0) break;
          }
          pcVar3 = paVar4[1].typeName;
          paVar4 = paVar4 + 1;
        } while (pcVar3 != (char *)0x0);
        iVar1 = paVar4->type;
        if (iVar1 == 0) {
          iVar1 = qMetaTypeCustomType_unlocked(pcVar5,iVar2);
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      if (((ulong)local_38 & 1) != 0) {
        local_38 = (Type *)((ulong)local_38 & 0xfffffffffffffffe);
        QReadWriteLock::unlock((QReadWriteLock *)local_38);
      }
    }
  }
  QMetaType(&local_60,iVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QMetaType)local_60.d_ptr;
  }
  __stack_chk_fail();
}

Assistant:

QMetaType QMetaType::fromName(QByteArrayView typeName)
{
    return QMetaType(qMetaTypeTypeImpl<TryNormalizeType>(typeName.data(), typeName.size()));
}